

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void monty_mul_into(MontyContext *mc,mp_int *r,mp_int *x,mp_int *y)

{
  BignumInt *pBVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  mp_int mVar5;
  mp_int tmp;
  mp_int local_38;
  
  uVar4 = mc->rw;
  if (uVar4 < x->nw) {
    __assert_fail("x->nw <= mc->rw",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x5c4,"void monty_mul_into(MontyContext *, mp_int *, mp_int *, mp_int *)");
  }
  if (y->nw <= uVar4) {
    uVar3 = mc->scratch->nw;
    local_38.nw = uVar4 * 2;
    uVar2 = uVar3 + uVar4 * -2;
    if (local_38.nw <= uVar3) {
      local_38.w = mc->scratch->w;
      if (uVar2 < uVar3) {
        uVar3 = uVar2;
      }
      pBVar1 = local_38.w + uVar4 * 2;
      mp_mul_into(&local_38,x,y);
      mVar5.w = pBVar1;
      mVar5.nw = uVar3;
      mVar5 = monty_reduce_internal(mc,&local_38,mVar5);
      uVar4 = mVar5.nw;
      if (r->nw < mVar5.nw) {
        uVar4 = r->nw;
      }
      memmove(r->w,mVar5.w,uVar4 * 8);
      smemclr(r->w + uVar4,(r->nw - uVar4) * 8);
      smemclr(mc->scratch->w,mc->scratch->nw << 3);
      return;
    }
    __assert_fail("len <= pool->nw",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
  }
  __assert_fail("y->nw <= mc->rw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x5c5,"void monty_mul_into(MontyContext *, mp_int *, mp_int *, mp_int *)");
}

Assistant:

void monty_mul_into(MontyContext *mc, mp_int *r, mp_int *x, mp_int *y)
{
    assert(x->nw <= mc->rw);
    assert(y->nw <= mc->rw);

    mp_int scratch = *mc->scratch;
    mp_int tmp = mp_alloc_from_scratch(&scratch, 2*mc->rw);
    mp_mul_into(&tmp, x, y);
    mp_int reduced = monty_reduce_internal(mc, &tmp, scratch);
    mp_copy_into(r, &reduced);
    mp_clear(mc->scratch);
}